

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O2

void __thiscall
FloatingPoint_DoubleBits_Test::FloatingPoint_DoubleBits_Test(FloatingPoint_DoubleBits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0313be70;
  return;
}

Assistant:

TEST(FloatingPoint, DoubleBits) {
    RNG rng(2);
    for (int i = 0; i < 100000; ++i) {
        uint64_t ui = (uint64_t(rng.Uniform<uint32_t>()) |
                       (uint64_t(rng.Uniform<uint32_t>()) << 32));
        double f = BitsToFloat(ui);

        if (std::isnan(f))
            continue;

        EXPECT_EQ(ui, FloatToBits(f));
    }
}